

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O1

pair<const_char_*,_bool> jsoncons::uri::is_pchar(iterator first,iterator last)

{
  byte ch;
  bool bVar1;
  long lVar2;
  assertion_error *this;
  byte bVar3;
  undefined8 extraout_RDX;
  ulong uVar4;
  iterator pvVar5;
  pair<const_char_*,_bool> pVar6;
  string local_40;
  
  if (first == last) {
    this = (assertion_error *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"assertion \'first != last\' failed at  <> :0","");
    assertion_error::assertion_error(this,&local_40);
    __cxa_throw(this,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
  }
  ch = *first;
  bVar1 = is_unreserved(ch);
  if (bVar1) {
    pvVar5 = first + 1;
    uVar4 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
    goto LAB_00468cbe;
  }
  lVar2 = 1;
  if (((long)last - (long)first < 3) || (*first != '%')) {
LAB_00468c83:
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    if (((byte)first[1] - 0x30 < 0x37) &&
       ((0x7e0000007e03ffU >> ((ulong)((byte)first[1] - 0x30) & 0x3f) & 1) != 0)) {
      bVar3 = first[2] - 0x30;
      if (0x36 < bVar3) goto LAB_00468c83;
      lVar2 = *(long *)(&DAT_0088da28 + (ulong)bVar3 * 8);
      uVar4 = CONCAT71(0x88db,(&DAT_0088dbe0)[bVar3]);
    }
  }
  if ((uVar4 & 1) == 0) {
    pvVar5 = first + 1;
    uVar4 = CONCAT71((int7)(uVar4 >> 8),
                     (ch == 0x40 || ch == 0x3a) |
                     (byte)(0x28001fd200000000 >> (ch & 0x3f)) & ch < 0x3e);
  }
  else {
    pvVar5 = first + lVar2;
  }
LAB_00468cbe:
  pVar6._8_8_ = uVar4;
  pVar6.first = pvVar5;
  return pVar6;
}

Assistant:

static std::pair<string_view::const_iterator,bool> is_pchar(string_view::iterator first, string_view::iterator last)
        {
            JSONCONS_ASSERT(first != last);
            
            const char c = *first;
            if (is_unreserved(c))
            {
                return std::pair<string_view::const_iterator,bool>{first+1,true};
            }
            auto result = is_pct_encoded(first,last);
            if (result.second)
            {
                return result;
            }
            
            return std::pair<string_view::const_iterator,bool>{first+1,is_sub_delim(c) || c == ':' || c == '@'};
        }